

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufile_mput.c
# Opt level: O0

ufile_error ufile_multiple_upload_finish(ufile_mutipart_state *self)

{
  CURL *curl_00;
  list_node *node_00;
  curls_list *pcVar1;
  ufile_error uVar2;
  etag_slist *list;
  http_body body;
  char local_88 [8];
  char query [64];
  http_options opt;
  CURL *curl;
  list_node *node;
  ufile_mutipart_state *self_local;
  ufile_error error;
  
  node_00 = get_curl_handle(self->curls);
  if (node_00 == (list_node *)0x0) {
    self_local = (ufile_mutipart_state *)0xfffffffb;
    error._0_8_ = anon_var_dwarf_5907;
  }
  else {
    curl_00 = node_00->curl;
    curl_easy_reset(curl_00);
    memset(local_88,0,0x40);
    sprintf(local_88,"uploadId=%s",self->upload_id);
    uVar2 = set_http_options((http_options *)(query + 0x38),"POST",self->mime_type,self->bucket_name
                             ,self->key,local_88);
    error._0_8_ = uVar2.message;
    body.pos_n._0_4_ = uVar2.code;
    self_local = (ufile_mutipart_state *)(ulong)(uint)body.pos_n;
    if (((uint)body.pos_n == 0) || ((int)(uint)body.pos_n / 100 == 2)) {
      memset(&list,0,0x20);
      body.f = (FILE *)self->etags->etag_buf;
      body.buffer = (char *)self->etags->pos;
      set_content_length((http_options *)(query + 0x38),(size_t)body.buffer);
      curl_easy_setopt(curl_00,0x4e2c,http_read_cb);
      curl_easy_setopt(curl_00,0x2e,1);
      curl_easy_setopt(curl_00,0x2719,&list);
      curl_easy_setopt(curl_00,0x75a3,body.buffer);
      curl_slist_append(opt.url,"Expect: ");
      set_curl_options(curl_00,(http_options *)(query + 0x38));
      uVar2 = curl_do(curl_00);
      error._0_8_ = uVar2.message;
      self_local = (ufile_mutipart_state *)(ulong)(uint)uVar2.code;
      http_cleanup((CURL *)0x0,(http_options *)(query + 0x38));
    }
  }
  pcVar1 = save_curl_handle(self->curls,node_00);
  self->curls = pcVar1;
  free_state(self);
  uVar2.message = (char *)error._0_8_;
  uVar2._0_8_ = self_local;
  return uVar2;
}

Assistant:

struct ufile_error
ufile_multiple_upload_finish(struct ufile_mutipart_state *self){
    struct ufile_error error=NO_ERROR;
    struct list_node *node = get_curl_handle(self->curls);
    if(node == NULL){
        error.code = UFILE_MULTIPLE_NOT_FINISH_ERROR_CODE;
        error.message = "Other upload_part have not finish yet, please check your code calling order.";
        goto FAILED;
    }
    CURL *curl = node->curl;
    curl_easy_reset(curl);

    struct http_options opt;
    char query[64]={0};
    sprintf(query, "uploadId=%s",self->upload_id);
    error = set_http_options(&opt, "POST", self->mime_type, self->bucket_name, self->key, query);
    if(UFILE_HAS_ERROR(error.code)){
        //set_http_options 在错误时不会分配内存，所以不需要释放。
        goto FAILED;
    }

    struct http_body body;
    memset(&body, 0, sizeof(struct http_body));
    struct etag_slist *list = self->etags;
    body.buffer = list->etag_buf;
    body.buffer_size = list->pos;
    set_content_length(&opt, body.buffer_size);
    curl_easy_setopt(curl, CURLOPT_READFUNCTION, http_read_cb);
    curl_easy_setopt(curl, CURLOPT_UPLOAD, 1L);
    curl_easy_setopt(curl, CURLOPT_READDATA, &body);
    curl_easy_setopt(curl, CURLOPT_INFILESIZE_LARGE, (curl_off_t)body.buffer_size);
    opt.header = curl_slist_append(opt.header, "Expect: ");

    set_curl_options(curl, &opt);

    error = curl_do(curl);
    http_cleanup(NULL, &opt);
FAILED:
    self->curls = save_curl_handle(self->curls, node); //把 curl 还回去，由 free_state 统一释放资源
    free_state(self);
    return error;
}